

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O3

Vec_Int_t * Abc_NtkCollectLatchValuesIvy(Abc_Ntk_t *pNtk,int fUseDcs)

{
  Vec_Int_t *p;
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  iVar4 = pNtk->nObjCounts[8];
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar4 - 1U) {
    iVar3 = iVar4;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar1 = (int *)0x0;
  }
  else {
    piVar1 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar1;
  pVVar2 = pNtk->vBoxes;
  if (0 < pVVar2->nSize) {
    lVar6 = 0;
    do {
      if ((*(uint *)((long)pVVar2->pArray[lVar6] + 0x14) & 0xf) == 8) {
        iVar4 = 3;
        if (fUseDcs == 0) {
          uVar5 = *(long *)((long)pVVar2->pArray[lVar6] + 0x38) - 1;
          if (2 < uVar5) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcIvy.c"
                          ,0x472,"Vec_Int_t *Abc_NtkCollectLatchValuesIvy(Abc_Ntk_t *, int)");
          }
          iVar4 = (int)uVar5 + 1;
        }
        Vec_IntPush(p,iVar4);
      }
      lVar6 = lVar6 + 1;
      pVVar2 = pNtk->vBoxes;
    } while (lVar6 < pVVar2->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkCollectLatchValuesIvy( Abc_Ntk_t * pNtk, int fUseDcs )
{
    Abc_Obj_t * pLatch;
    Vec_Int_t * vArray;
    int i;
    vArray = Vec_IntAlloc( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( fUseDcs || Abc_LatchIsInitDc(pLatch) )
            Vec_IntPush( vArray, IVY_INIT_DC );
        else if ( Abc_LatchIsInit1(pLatch) )
            Vec_IntPush( vArray, IVY_INIT_1 );
        else if ( Abc_LatchIsInit0(pLatch) )
            Vec_IntPush( vArray, IVY_INIT_0 );
        else assert( 0 );
    }
    return vArray;
}